

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZFunction<double>_> * __thiscall
TPZAutoPointer<TPZFunction<double>_>::operator=
          (TPZAutoPointer<TPZFunction<double>_> *this,TPZFunction<double> *rval)

{
  bool bVar1;
  TPZFunction<double> *pTVar2;
  TPZFunction<double> *in_RSI;
  TPZReference *in_RDI;
  TPZAutoPointer<TPZFunction<double>_> *in_stack_ffffffffffffffd0;
  TPZReference *this_00;
  
  this_00 = in_RDI;
  if ((in_RDI->fPointer != (TPZFunction<double> *)0x0) &&
     (bVar1 = TPZReference::Decrease(in_RDI), bVar1)) {
    Release(in_stack_ffffffffffffffd0);
  }
  pTVar2 = (TPZFunction<double> *)operator_new(0x10);
  TPZReference::TPZReference(this_00,in_RSI);
  in_RDI->fPointer = pTVar2;
  return (TPZAutoPointer<TPZFunction<double>_> *)in_RDI;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }